

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

void __thiscall
Centaurus::Grammar<char>::print_catn(Grammar<char> *this,wostream *os,Identifier *id)

{
  CATNMachine<char> *this_00;
  wstring *name;
  undefined1 local_68 [8];
  CompositeATN<char> catn;
  Identifier *id_local;
  wostream *os_local;
  Grammar<char> *this_local;
  
  catn.m_dict._M_h._M_single_bucket = (__node_base_ptr)id;
  CompositeATN<char>::CompositeATN((CompositeATN<char> *)local_68,this);
  this_00 = CompositeATN<char>::operator[]
                      ((CompositeATN<char> *)local_68,
                       (Identifier *)catn.m_dict._M_h._M_single_bucket);
  name = Identifier::str_abi_cxx11_((Identifier *)catn.m_dict._M_h._M_single_bucket);
  CATNMachine<char>::print(this_00,os,name);
  CompositeATN<char>::~CompositeATN((CompositeATN<char> *)local_68);
  return;
}

Assistant:

void Grammar<TCHAR>::print_catn(std::wostream& os, const Identifier& id) const
{
    CompositeATN<TCHAR> catn(*this);

    catn[id].print(os, id.str());
}